

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::FunctionalTest20_21
          (FunctionalTest20_21 *this,Context *context)

{
  uint local_20;
  uint local_1c;
  GLuint i_1;
  GLuint i;
  Context *context_local;
  FunctionalTest20_21 *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"multiple_contexts",
             "Verifies that shader uniforms are preserved when rendering context is switched.");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FunctionalTest20_21_03243c70;
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    this->m_program_pipelines[local_1c] = 0;
  }
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    this->m_shared_contexts[local_20] = (RenderContext *)0x0;
  }
  return;
}

Assistant:

FunctionalTest20_21::FunctionalTest20_21(deqp::Context& context)
	: TestCase(context, "multiple_contexts",
			   "Verifies that shader uniforms are preserved when rendering context is switched.")
{
	for (GLuint i = 0; i < m_n_shared_contexts + 1; ++i)
	{
		m_program_pipelines[i] = 0;
	}

	for (GLuint i = 0; i < m_n_shared_contexts; ++i)
	{
		m_shared_contexts[i] = 0;
	}
}